

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>::
operator==(result *__return_storage_ptr__,
          expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>
          *this,char (*rhs) [6])

{
  lest *this_00;
  bool bVar1;
  char (*in_R8) [6];
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  bool local_a8;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  basic_string_view<char,_std::char_traits<char>_> local_80;
  char local_70 [16];
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40.data_ = (const_pointer)**(undefined8 **)this;
  local_40.size_ = (*(undefined8 **)this)[1];
  bVar1 = nonstd::sv_lite::operator==(&local_40,*rhs);
  this_00 = *(lest **)this;
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"==","");
  local_80.data_ = local_70;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_e8,local_e8 + local_e0);
  to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,char[6]>
            (&local_60,this_00,&local_80,(string *)rhs,in_R8);
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,local_60._M_dataplus._M_p,
             local_60._M_dataplus._M_p + local_60._M_string_length);
  local_a8 = bVar1;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_c8,local_c8 + local_c0);
  __return_storage_ptr__->passed = local_a8;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_a0,local_a0 + local_98);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80.data_ != local_70) {
    operator_delete(local_80.data_);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }